

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl_tree.c
# Opt level: O0

void printTree0(NodeAVL *nd,int nest)

{
  int in_ESI;
  uint *in_RDI;
  int parent;
  int rSon;
  int lSon;
  int node;
  int i;
  uint local_20;
  uint local_1c;
  uint local_18;
  uint nest_00;
  int iVar1;
  
  if (in_RDI != (uint *)0x0) {
    for (iVar1 = 0; SBORROW4(iVar1,in_ESI * 10) != iVar1 + in_ESI * -10 < 0; iVar1 = iVar1 + 1) {
      printf(" ");
    }
    nest_00 = *in_RDI;
    local_18 = 0xffffffff;
    local_1c = 0xffffffff;
    local_20 = 0xffffffff;
    if (*(long *)(in_RDI + 0xc) != 0) {
      local_20 = **(uint **)(in_RDI + 0xc);
    }
    if (*(long *)(in_RDI + 8) != 0) {
      local_18 = **(uint **)(in_RDI + 8);
    }
    if (*(long *)(in_RDI + 10) != 0) {
      local_1c = **(uint **)(in_RDI + 10);
    }
    printf("n=%3d k=%6.4f p=%3d l=%3d r=%3d\n",*(undefined8 *)(in_RDI + 2),(ulong)nest_00,
           (ulong)local_20,(ulong)local_18,(ulong)local_1c);
    printTree0((NodeAVL *)CONCAT44(in_ESI,iVar1),nest_00);
    printTree0((NodeAVL *)CONCAT44(in_ESI,iVar1),nest_00);
  }
  return;
}

Assistant:

static
void printTree0( NodeAVL *nd, const int nest ){
    if ( !nd ) return;
    int i; for ( i = 0; i < 10*nest; ++i ) printf( " " );
    int node = nd->id, lSon = -1, rSon=-1, parent = -1;
    if ( nd->parent ) parent = nd->parent->id;
    if ( nd->left ) lSon = nd->left->id;
    if ( nd->right ) rSon = nd->right->id;
    printf( "n=%3d k=%6.4f p=%3d l=%3d r=%3d\n", node, nd->key, parent, lSon, rSon );
    printTree0( nd->left, nest+1 );
    printTree0( nd->right, nest+1 );
}